

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O2

Status * __thiscall
draco::PointCloudDecoder::DecodeStep1
          (Status *__return_storage_ptr__,PointCloudDecoder *this,DecoderOptions *options,
          DecoderBuffer *in_buffer,PointCloud *out_point_cloud)

{
  string *this_00;
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  Status *_local_status;
  DracoHeader header;
  allocator<char> local_51;
  string local_50 [36];
  DracoHeader local_2c;
  
  this->options_ = options;
  this->buffer_ = in_buffer;
  this->point_cloud_ = out_point_cloud;
  DecodeHeader(__return_storage_ptr__,in_buffer,&local_2c);
  if (__return_storage_ptr__->code_ == OK) {
    this_00 = &__return_storage_ptr__->error_msg_;
    std::__cxx11::string::~string((string *)this_00);
    uVar1 = local_2c.encoder_type;
    uVar2 = (*this->_vptr_PointCloudDecoder[2])(this);
    if (uVar2 == uVar1) {
      this->version_major_ = local_2c.version_major;
      this->version_minor_ = local_2c.version_minor;
      if ((byte)(local_2c.version_major - 3) < 0xfe) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_50,"Unknown major version.",&local_51);
        __return_storage_ptr__->code_ = UNKNOWN_VERSION;
        std::__cxx11::string::string((string *)this_00,local_50);
      }
      else if ((local_2c.version_major == '\x02') &&
              ((byte)((local_2c.encoder_type == 0) + 2U) < local_2c.version_minor)) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_50,"Unknown minor version.",&local_51);
        __return_storage_ptr__->code_ = UNKNOWN_VERSION;
        std::__cxx11::string::string((string *)this_00,local_50);
      }
      else {
        this->buffer_->bitstream_version_ = CONCAT11(local_2c.version_major,local_2c.version_minor);
        if ((0x102 < CONCAT11(local_2c.version_major,local_2c.version_minor)) &&
           ((short)local_2c.flags < 0)) {
          DecodeMetadata(__return_storage_ptr__,this);
          if (__return_storage_ptr__->code_ != OK) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)this_00);
        }
        iVar3 = (*this->_vptr_PointCloudDecoder[3])(this);
        if ((char)iVar3 == '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_50,"Failed to initialize the decoder.",&local_51);
          __return_storage_ptr__->code_ = DRACO_ERROR;
          std::__cxx11::string::string((string *)this_00,local_50);
        }
        else {
          iVar3 = (*this->_vptr_PointCloudDecoder[5])(this);
          if ((char)iVar3 == '\0') {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_50,"Failed to decode geometry data.",&local_51);
            __return_storage_ptr__->code_ = DRACO_ERROR;
            std::__cxx11::string::string((string *)this_00,local_50);
          }
          else {
            iVar3 = (*this->_vptr_PointCloudDecoder[6])(this);
            if ((char)iVar3 != '\0') {
              __return_storage_ptr__->code_ = OK;
              (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->error_msg_).field_2;
              (__return_storage_ptr__->error_msg_)._M_string_length = 0;
              (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
              return __return_storage_ptr__;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      (local_50,"Failed to decode point attributes.",&local_51);
            __return_storage_ptr__->code_ = DRACO_ERROR;
            std::__cxx11::string::string((string *)this_00,local_50);
          }
        }
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                (local_50,"Using incompatible decoder for the input geometry.",&local_51);
      __return_storage_ptr__->code_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)this_00,local_50);
    }
    std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudDecoder::DecodeStep1(const DecoderOptions &options,
                                 DecoderBuffer *in_buffer,
                                 PointCloud *out_point_cloud) {
  options_ = &options;
  buffer_ = in_buffer;
  point_cloud_ = out_point_cloud;
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(DecodeHeader(buffer_, &header))
  // Sanity check that we are really using the right decoder (mostly for cases
  // where the Decode method was called manually outside of our main API.
  if (header.encoder_type != GetGeometryType()) {
    return Status(Status::DRACO_ERROR,
                  "Using incompatible decoder for the input geometry.");
  }
  // TODO(ostava): We should check the method as well, but currently decoders
  // don't expose the decoding method id.
  version_major_ = header.version_major;
  version_minor_ = header.version_minor;

  const uint8_t max_supported_major_version =
      header.encoder_type == POINT_CLOUD ? kDracoPointCloudBitstreamVersionMajor
                                         : kDracoMeshBitstreamVersionMajor;
  const uint8_t max_supported_minor_version =
      header.encoder_type == POINT_CLOUD ? kDracoPointCloudBitstreamVersionMinor
                                         : kDracoMeshBitstreamVersionMinor;

  // Check for version compatibility.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (version_major_ < 1 || version_major_ > max_supported_major_version) {
    return Status(Status::UNKNOWN_VERSION, "Unknown major version.");
  }
  if (version_major_ == max_supported_major_version &&
      version_minor_ > max_supported_minor_version) {
    return Status(Status::UNKNOWN_VERSION, "Unknown minor version.");
  }
#else
  if (version_major_ != max_supported_major_version) {
    return Status(Status::UNKNOWN_VERSION, "Unsupported major version.");
  }
  if (version_minor_ != max_supported_minor_version) {
    return Status(Status::UNKNOWN_VERSION, "Unsupported minor version.");
  }
#endif
  buffer_->set_bitstream_version(
      DRACO_BITSTREAM_VERSION(version_major_, version_minor_));

  if (bitstream_version() >= DRACO_BITSTREAM_VERSION(1, 3) &&
      (header.flags & METADATA_FLAG_MASK)) {
    DRACO_RETURN_IF_ERROR(DecodeMetadata())
  }
  if (!InitializeDecoder()) {
    return Status(Status::DRACO_ERROR, "Failed to initialize the decoder.");
  }
  if (!DecodeGeometryData()) {
    return Status(Status::DRACO_ERROR, "Failed to decode geometry data.");
  }
  if (!DecodePointAttributesStep1()) {
    return Status(Status::DRACO_ERROR, "Failed to decode point attributes.");
  }
  return OkStatus();
}